

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pc-identifiers.c
# Opt level: O0

FUNCTION_RETURN
generate_pc_id(PcIdentifier *identifiers,uint *array_size,IDENTIFICATION_STRATEGY strategy)

{
  uint uVar1;
  uint uStack_30;
  uchar strategy_num;
  uint original_array_size;
  uint j;
  uint i;
  FUNCTION_RETURN result;
  IDENTIFICATION_STRATEGY strategy_local;
  uint *array_size_local;
  PcIdentifier *identifiers_local;
  
  uVar1 = *array_size;
  switch(strategy) {
  case DEFAULT:
    j = generate_default_pc_id(identifiers,array_size);
    break;
  case ETHERNET:
    j = generate_ethernet_pc_id(identifiers,array_size,1);
    break;
  case IP_ADDRESS:
    j = generate_ethernet_pc_id(identifiers,array_size,0);
    break;
  case DISK_NUM:
    j = generate_disk_pc_id(identifiers,array_size,false);
    break;
  case DISK_LABEL:
    j = generate_disk_pc_id(identifiers,array_size,true);
    break;
  default:
    return FUNC_RET_ERROR;
  }
  if ((j == 0) && (identifiers != (PcIdentifier *)0x0)) {
    for (original_array_size = 0; original_array_size < *array_size;
        original_array_size = original_array_size + 1) {
      identifiers[original_array_size][0] =
           identifiers[original_array_size][0] & 0xf | (byte)(strategy << 5);
    }
    for (original_array_size = *array_size; original_array_size < uVar1;
        original_array_size = original_array_size + 1) {
      identifiers[original_array_size][0] = 0xc0;
      for (uStack_30 = 1; uStack_30 < 6; uStack_30 = uStack_30 + 1) {
        identifiers[original_array_size][uStack_30] = '*';
      }
    }
  }
  return j;
}

Assistant:

FUNCTION_RETURN generate_pc_id(PcIdentifier * identifiers,
		unsigned int * array_size, IDENTIFICATION_STRATEGY strategy) {
	FUNCTION_RETURN result;
	unsigned int i, j;
	const unsigned int original_array_size = *array_size;
	unsigned char strategy_num;
	switch (strategy) {
	case DEFAULT:
		result = generate_default_pc_id(identifiers, array_size);
		break;
	case ETHERNET:
		result = generate_ethernet_pc_id(identifiers, array_size, true);
		break;
	case IP_ADDRESS:
		result = generate_ethernet_pc_id(identifiers, array_size, false);
		break;
	case DISK_NUM:
		result = generate_disk_pc_id(identifiers, array_size, false);
		break;
	case DISK_LABEL:
		result = generate_disk_pc_id(identifiers, array_size, true);
		break;
	default:
		return FUNC_RET_ERROR;
	}

	if (result == FUNC_RET_OK && identifiers != NULL) {
		strategy_num = strategy << 5;
		for (i = 0; i < *array_size; i++) {
			//encode strategy in the first three bits of the pc_identifier
			identifiers[i][0] = (identifiers[i][0] & 15) | strategy_num;
		}
		//fill array if larger
		for (i = *array_size; i < original_array_size; i++) {
			identifiers[i][0] = STRATEGY_UNKNOWN << 5;
			for (j = 1; j < sizeof(PcIdentifier); j++) {
				identifiers[i][j] = 42; //padding
			}
		}
	}
	return result;
}